

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_ScaleVelocity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  PClass *pPVar5;
  int iVar6;
  undefined4 extraout_var;
  AActor *pAVar8;
  char *pcVar9;
  bool bVar10;
  PClass *pPVar7;
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_003daac6;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003daab6:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003daac6:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x12a4,
                  "int AF_AActor_A_ScaleVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar8 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar8 == (AActor *)0x0) goto LAB_003da9bf;
    pPVar7 = (pAVar8->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar6 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar6);
      (pAVar8->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar10 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar5 && bVar10) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar5) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003daac6;
    }
  }
  else {
    if (pAVar8 != (AActor *)0x0) goto LAB_003daab6;
LAB_003da9bf:
    pAVar8 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar9 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      dVar1 = param[1].field_0.f;
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type != '\0') {
          pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
          goto LAB_003dab0d;
        }
      }
      else if (param[2].field_0.field_3.Type != '\0') {
        pcVar9 = "(param[paramnum]).Type == REGT_INT";
LAB_003dab0d:
        __assert_fail(pcVar9,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x12a6,
                      "int AF_AActor_A_ScaleVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pAVar8 = COPY_AAPTR(pAVar8,param[2].field_0.i);
      if (pAVar8 != (AActor *)0x0) {
        dVar3 = (pAVar8->Vel).X;
        dVar4 = (pAVar8->Vel).Y;
        if ((((dVar3 != 0.0) || (NAN(dVar3))) || (dVar4 != 0.0)) || (NAN(dVar4))) {
          (pAVar8->Vel).X = dVar1 * dVar3;
          (pAVar8->Vel).Y = dVar1 * dVar4;
          (pAVar8->Vel).Z = dVar1 * (pAVar8->Vel).Z;
        }
        else {
          dVar2 = (pAVar8->Vel).Z;
          (pAVar8->Vel).X = dVar1 * dVar3;
          (pAVar8->Vel).Y = dVar1 * dVar4;
          (pAVar8->Vel).Z = dVar1 * dVar2;
          if ((dVar2 == 0.0) && (!NAN(dVar2))) {
            return 0;
          }
        }
        CheckStopped(pAVar8);
      }
      return 0;
    }
    pcVar9 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x12a5,
                "int AF_AActor_A_ScaleVelocity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ScaleVelocity)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(scale);
	PARAM_INT_DEF(ptr);

	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref == NULL)
	{
		return 0;
	}

	bool was_moving = !ref->Vel.isZero();

	ref->Vel *= scale;

	// If the actor was previously moving but now is not, and is a player,
	// update its player variables. (See A_Stop.)
	if (was_moving)
	{
		CheckStopped(ref);
	}
	return 0;
}